

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O2

void __thiscall
jaegertracing::thrift::AggregationValidatorClient::send_validateTrace
          (AggregationValidatorClient *this,string *traceId)

{
  TProtocol *pTVar1;
  size_t __n;
  void *__buf;
  __shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_48;
  AggregationValidator_validateTrace_pargs args;
  
  pTVar1 = this->oprot_;
  std::__cxx11::string::string((string *)&args,"validateTrace",(allocator *)&local_48);
  __n = 0;
  (*pTVar1->_vptr_TProtocol[2])(pTVar1,&args,1);
  std::__cxx11::string::~string((string *)&args);
  args._vptr_AggregationValidator_validateTrace_pargs =
       (_func_int **)&PTR__AggregationValidator_validateTrace_pargs_00299a68;
  args.traceId = traceId;
  AggregationValidator_validateTrace_pargs::write(&args,(int)this->oprot_,__buf,__n);
  (*this->oprot_->_vptr_TProtocol[3])();
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->oprot_->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (*(local_48._M_ptr)->_vptr_TTransport[10])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->oprot_->ptrans_).
              super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>)
  ;
  (*(local_48._M_ptr)->_vptr_TTransport[0xb])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  AggregationValidator_validateTrace_pargs::~AggregationValidator_validateTrace_pargs(&args);
  return;
}

Assistant:

void AggregationValidatorClient::send_validateTrace(const std::string& traceId)
{
  int32_t cseqid = 0;
  oprot_->writeMessageBegin("validateTrace", ::apache::thrift::protocol::T_CALL, cseqid);

  AggregationValidator_validateTrace_pargs args;
  args.traceId = &traceId;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();
}